

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkInterface
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget,bool secondPass)

{
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  reference __x;
  cmLinkImplementation *this_00;
  reference __x_00;
  cmLinkImplementationLibraries *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar7;
  allocator<char> local_1f1;
  string local_1f0;
  cmValue local_1d0;
  cmValue reps;
  cmValue config_reps;
  cmAlphaNum local_190;
  undefined1 local_160 [8];
  string propName;
  allocator<char> local_119;
  undefined1 local_118 [8];
  string suffix;
  cmLinkImplementation *impl_2;
  cmLinkImplementationLibraries *impl_1;
  cmLinkImplItem *lib_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range4;
  cmLinkImplementation *impl;
  cmLinkItem *lib;
  iterator __end3;
  iterator __begin3;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  bool secondPass_local;
  cmGeneratorTarget *headTarget_local;
  cmOptionalLinkInterface *iface_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = secondPass;
  if (((iface->super_cmLinkInterface).field_0xf5 & 1) == 0) {
    PVar3 = GetPolicyStatusCMP0022(this);
    if ((PVar3 == WARN) || (PVar3 = GetPolicyStatusCMP0022(this), PVar3 == OLD)) {
      pcVar4 = GetLinkImplementationLibrariesInternal(this,config,headTarget,Link);
      (iface->super_cmLinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_cmLinkInterface).WrongConfigLibraries,&pcVar4->WrongConfigLibraries)
      ;
    }
  }
  else {
    TVar2 = GetType(this);
    if (((TVar2 == SHARED_LIBRARY) || (TVar2 = GetType(this), TVar2 == STATIC_LIBRARY)) ||
       (TVar2 = GetType(this), TVar2 == INTERFACE_LIBRARY)) {
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set
                ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)&__range3);
      __end3 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                         ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      lib = (cmLinkItem *)
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                         *)&lib), bVar1) {
        __x = __gnu_cxx::
              __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
              ::operator*(&__end3);
        std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                  ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)&__range3,
                   __x);
        __gnu_cxx::
        __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
        operator++(&__end3);
      }
      TVar2 = GetType(this);
      if (TVar2 != INTERFACE_LIBRARY) {
        this_00 = GetLinkImplementation
                            (this,config,Link,
                             (bool)(emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ &
                                   1));
        __end4 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                           ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00);
        lib_1 = (cmLinkImplItem *)
                std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                          ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                           *)&lib_1), bVar1) {
          __x_00 = __gnu_cxx::
                   __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                   ::operator*(&__end4);
          pVar7 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                            ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                             &__range3,&__x_00->super_cmLinkItem);
          if (((((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
              ((__x_00->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0)) &&
             (TVar2 = GetType((__x_00->super_cmLinkItem).Target), TVar2 == SHARED_LIBRARY)) {
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                      (&(iface->super_cmLinkInterface).SharedDeps,&__x_00->super_cmLinkItem);
          }
          __gnu_cxx::
          __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
          ::operator++(&__end4);
        }
      }
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::~set
                ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)&__range3);
    }
  }
  bVar1 = LinkLanguagePropagatesToDependents(this);
  if ((bVar1) &&
     (suffix.field_2._8_8_ =
           GetLinkImplementation
                     (this,config,Link,
                      (bool)(emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1)),
     (cmLinkImplementation *)suffix.field_2._8_8_ != (cmLinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_cmLinkInterface).Languages,
                &((cmLinkImplementation *)suffix.field_2._8_8_)->Languages);
  }
  TVar2 = GetType(this);
  if (TVar2 == STATIC_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"_",&local_119);
    std::allocator<char>::~allocator(&local_119);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cmsys::SystemTools::UpperCase((string *)((long)&propName.field_2 + 8),config);
      std::__cxx11::string::operator+=
                ((string *)local_118,(string *)(propName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(propName.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::operator+=((string *)local_118,"NOCONFIG");
    }
    cmAlphaNum::cmAlphaNum(&local_190,"LINK_INTERFACE_MULTIPLICITY");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_reps,(string *)local_118);
    cmStrCat<>((string *)local_160,&local_190,(cmAlphaNum *)&config_reps);
    reps = GetProperty(this,(string *)local_160);
    bVar1 = cmValue::operator_cast_to_bool(&reps);
    if (bVar1) {
      cmValue::operator->[abi_cxx11_(&reps);
      uVar6 = std::__cxx11::string::c_str();
      __isoc99_sscanf(uVar6,"%u",&(iface->super_cmLinkInterface).Multiplicity);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"LINK_INTERFACE_MULTIPLICITY",&local_1f1);
      local_1d0 = GetProperty(this,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      bVar1 = cmValue::operator_cast_to_bool(&local_1d0);
      if (bVar1) {
        cmValue::operator->[abi_cxx11_(&local_1d0);
        uVar6 = std::__cxx11::string::c_str();
        __isoc99_sscanf(uVar6,"%u",&(iface->super_cmLinkInterface).Multiplicity);
      }
    }
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_118);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterface(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget, bool secondPass) const
{
  if (iface.Explicit) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      std::set<cmLinkItem> emitted;
      for (cmLinkItem const& lib : iface.Libraries) {
        emitted.insert(lib);
      }
      if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
        cmLinkImplementation const* impl = this->GetLinkImplementation(
          config, LinkInterfaceFor::Link, secondPass);
        for (cmLinkImplItem const& lib : impl->Libraries) {
          if (emitted.insert(lib).second) {
            if (lib.Target) {
              // This is a runtime dependency on another shared library.
              if (lib.Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
                iface.SharedDeps.push_back(lib);
              }
            } else {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that
              // creates a chicken-and-egg problem since this list is needed
              // for its construction.
            }
          }
        }
      }
    }
  } else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN ||
             this->GetPolicyStatusCMP0022() == cmPolicies::OLD) {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget,
                                                   LinkInterfaceFor::Link);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
  }

  if (this->LinkLanguagePropagatesToDependents()) {
    // Targets using this archive need its language runtime libraries.
    if (cmLinkImplementation const* impl = this->GetLinkImplementation(
          config, LinkInterfaceFor::Link, secondPass)) {
      iface.Languages = impl->Languages;
    }
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if (!config.empty()) {
      suffix += cmSystemTools::UpperCase(config);
    } else {
      suffix += "NOCONFIG";
    }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = cmStrCat("LINK_INTERFACE_MULTIPLICITY", suffix);
    if (cmValue config_reps = this->GetProperty(propName)) {
      sscanf(config_reps->c_str(), "%u", &iface.Multiplicity);
    } else if (cmValue reps =
                 this->GetProperty("LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps->c_str(), "%u", &iface.Multiplicity);
    }
  }
}